

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_parse_data_fd(ly_ctx *ctx,int fd,LYD_FORMAT format,uint32_t parse_options,
                        uint32_t validate_options,lyd_node **tree)

{
  LY_ERR LVar1;
  ly_in *in;
  ly_in *local_38;
  
  LVar1 = ly_in_new_fd(fd,&local_38);
  if (LVar1 == LY_SUCCESS) {
    LVar1 = lyd_parse_data(ctx,(lyd_node *)0x0,local_38,format,parse_options,validate_options,tree);
    ly_in_free(local_38,'\0');
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_parse_data_fd(const struct ly_ctx *ctx, int fd, LYD_FORMAT format, uint32_t parse_options, uint32_t validate_options,
        struct lyd_node **tree)
{
    LY_ERR ret;
    struct ly_in *in;

    LY_CHECK_RET(ly_in_new_fd(fd, &in));
    ret = lyd_parse_data(ctx, NULL, in, format, parse_options, validate_options, tree);

    ly_in_free(in, 0);
    return ret;
}